

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPhysicsItem.h
# Opt level: O1

void __thiscall
chrono::ChPhysicsItem::IntStateIncrement
          (ChPhysicsItem *this,uint off_x,ChState *x_new,ChState *x,uint off_v,ChStateDelta *Dv)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  iVar1 = (**(code **)(*(long *)this + 0xb0))();
  if (0 < iVar1) {
    lVar4 = 0;
    do {
      uVar2 = (ulong)(off_x + (int)lVar4);
      if ((*(long *)(x + 8) <= (long)uVar2) ||
         (uVar3 = (ulong)(off_v + (int)lVar4), *(long *)(Dv + 8) <= (long)uVar3)) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                     );
      }
      if (*(long *)(x_new + 8) <= (long)uVar2) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      *(double *)(*(long *)x_new + uVar2 * 8) =
           *(double *)(*(long *)x + uVar2 * 8) + *(double *)(*(long *)Dv + uVar3 * 8);
      lVar4 = lVar4 + 1;
      iVar1 = (**(code **)(*(long *)this + 0xb0))(this);
    } while (lVar4 < iVar1);
  }
  return;
}

Assistant:

virtual void IntStateIncrement(const unsigned int off_x,  ///< offset in x state vector
                                   ChState& x_new,            ///< state vector, position part, incremented result
                                   const ChState& x,          ///< state vector, initial position part
                                   const unsigned int off_v,  ///< offset in v state vector
                                   const ChStateDelta& Dv     ///< state vector, increment
    ) {
        for (int i = 0; i < GetDOF(); ++i) {
            x_new(off_x + i) = x(off_x + i) + Dv(off_v + i);
        }
    }